

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O0

int __thiscall PolledFile::Impl::poll(Impl *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  char *pcVar2;
  undefined7 extraout_var;
  Impl *pIVar3;
  undefined7 extraout_var_01;
  undefined8 uVar4;
  size_type sVar5;
  undefined1 local_30 [8];
  Metadata new_metadata;
  Impl *this_local;
  undefined7 extraout_var_00;
  
  new_metadata.time.tv_nsec = (__syscall_slong_t)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  readFileMetadata((Metadata *)local_30,pcVar2);
  bVar1 = Metadata::valid((Metadata *)local_30);
  if (bVar1) {
    bVar1 = Metadata::operator==((Metadata *)local_30,&this->metadata_);
    pIVar3 = (Impl *)CONCAT71(extraout_var_00,bVar1);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = readFileContents(pcVar2,&this->buffer_);
      if (bVar1) {
        uVar4 = std::__cxx11::string::c_str();
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
        aAppDebugPrintf("Read file %s, %d bytes",uVar4,sVar5 & 0xffffffff);
        (this->metadata_).size = (size_t)local_30;
        (this->metadata_).time.tv_sec = new_metadata.size;
        (this->metadata_).time.tv_nsec = new_metadata.time.tv_sec;
        this_local._7_1_ = 1;
        pIVar3 = this;
      }
      else {
        this_local._7_1_ = 0;
        pIVar3 = (Impl *)CONCAT71(extraout_var_01,bVar1);
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    pIVar3 = (Impl *)CONCAT71(extraout_var,bVar1);
  }
  return (int)CONCAT71((int7)((ulong)pIVar3 >> 8),this_local._7_1_);
}

Assistant:

bool poll() {
		const Metadata new_metadata = readFileMetadata(filename_.c_str());
		if (!new_metadata.valid())
			return false;

		if (new_metadata == metadata_)
			return false;

		if (!readFileContents(filename_.c_str(), buffer_))
			return false;

		MSG("Read file %s, %d bytes", filename_.c_str(), (int)buffer_.size());
		metadata_ = new_metadata;
		return true;
	}